

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker *mpac,msgpack_unpacked *result,size_t *p_bytes)

{
  msgpack_unpack_return mVar1;
  int ret;
  size_t *p_bytes_local;
  msgpack_unpacked *result_local;
  msgpack_unpacker *mpac_local;
  
  mVar1 = unpacker_next(mpac,result);
  if ((mVar1 == MSGPACK_UNPACK_SUCCESS) || (mVar1 == MSGPACK_UNPACK_CONTINUE)) {
    *p_bytes = mpac->parsed;
  }
  if (mVar1 == MSGPACK_UNPACK_SUCCESS) {
    msgpack_unpacker_reset(mpac);
  }
  return mVar1;
}

Assistant:

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker* mpac,
                                msgpack_unpacked* result, size_t *p_bytes)
{
    int ret;

    ret = unpacker_next(mpac, result);
    if (ret == MSGPACK_UNPACK_SUCCESS || ret == MSGPACK_UNPACK_CONTINUE) {
        *p_bytes = mpac->parsed;
    }

    if (ret == MSGPACK_UNPACK_SUCCESS) {
        msgpack_unpacker_reset(mpac);
    }

    return ret;
}